

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogv.c
# Opt level: O1

_Bool ogv_start_video(ALLEGRO_VIDEO *video)

{
  void *pvVar1;
  char cVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  pvVar1 = video->data;
  if (*(long *)((long)pvVar1 + 0x168) == 0) {
    lVar3 = al_create_thread(decode_thread_func,video);
    *(long *)((long)pvVar1 + 0x168) = lVar3;
    if (lVar3 != 0) {
      al_init_user_event_source((long)pvVar1 + 0xd0);
      uVar4 = al_create_event_queue();
      *(undefined8 *)((long)pvVar1 + 0x150) = uVar4;
      uVar4 = al_create_mutex();
      *(undefined8 *)((long)pvVar1 + 0x158) = uVar4;
      uVar4 = al_create_cond();
      *(undefined8 *)((long)pvVar1 + 0x160) = uVar4;
      al_register_event_source(*(undefined8 *)((long)pvVar1 + 0x150),(long)pvVar1 + 0xd0);
      al_start_thread(*(undefined8 *)((long)pvVar1 + 0x168));
      return true;
    }
    cVar2 = _al_trace_prefix("video",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/video/ogv.c"
                             ,0x4ec,"ogv_start_video");
    if (cVar2 == '\0') {
      return false;
    }
    pcVar5 = "Could not create thread.\n";
  }
  else {
    cVar2 = _al_trace_prefix("video",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/video/ogv.c"
                             ,0x4e6,"ogv_start_video");
    if (cVar2 == '\0') {
      return false;
    }
    pcVar5 = "Thread already created.\n";
  }
  _al_trace_suffix(pcVar5);
  return false;
}

Assistant:

static bool ogv_start_video(ALLEGRO_VIDEO *video)
{
   OGG_VIDEO *ogv = video->data;

   if (ogv->thread != NULL) {
      ALLEGRO_ERROR("Thread already created.\n");
      return false;
   }

   ogv->thread = al_create_thread(decode_thread_func, video);
   if (!ogv->thread) {
      ALLEGRO_ERROR("Could not create thread.\n");
      return false;
   }

   al_init_user_event_source(&ogv->evtsrc);
   ogv->queue = al_create_event_queue();
   ogv->mutex = al_create_mutex();
   ogv->cond = al_create_cond();

   al_register_event_source(ogv->queue, &ogv->evtsrc);

   al_start_thread(ogv->thread);
   return true;
}